

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

PropResult __thiscall
Clasp::ClauseHead::propagate(ClauseHead *this,Solver *s,Literal p,uint32 *param_4)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RSI;
  ClauseHead *in_RDI;
  uint32 wLit;
  Literal *head;
  Literal *in_stack_ffffffffffffff68;
  ClauseWatch *in_stack_ffffffffffffff70;
  Solver *in_stack_ffffffffffffff78;
  Literal *a;
  Literal *in_stack_ffffffffffffff80;
  Literal LVar3;
  Solver *in_stack_ffffffffffffff88;
  Antecedent local_60;
  ClauseWatch local_58;
  uint32 local_4c;
  ClauseWatch local_48;
  uint32 local_40;
  uint32 local_3c;
  uint32 local_38;
  uint32 local_34;
  uint32 local_30;
  uint local_2c;
  Literal *local_28;
  undefined8 local_18;
  PropResult local_2;
  
  local_28 = in_RDI->head_;
  local_18 = in_RSI;
  local_30 = (uint32)Literal::operator~(in_stack_ffffffffffffff68);
  bVar1 = Clasp::operator==((Literal *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_2c = (uint)bVar1;
  local_34 = local_28[1 - local_2c].rep_;
  bVar1 = Solver::isTrue(in_stack_ffffffffffffff78,
                         (Literal)(uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  if (bVar1) {
    Constraint::PropResult::PropResult(&local_2,true,true);
  }
  else {
    local_38 = local_28[2].rep_;
    bVar1 = Solver::isFalse(in_stack_ffffffffffffff78,
                            (Literal)(uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    if (bVar1) {
      uVar2 = (*(in_RDI->super_Constraint)._vptr_Constraint[0x17])(in_RDI,local_18,(ulong)local_2c);
      if ((uVar2 & 1) == 0) {
        a = in_RDI->head_ + (local_2c ^ 1);
        Antecedent::Antecedent(&local_60,&in_RDI->super_Constraint);
        bVar1 = Solver::force(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(Antecedent *)a);
        Constraint::PropResult::PropResult(&local_2,bVar1,true);
      }
      else {
        LVar3.rep_ = local_18._4_4_;
        local_4c = (uint32)Literal::operator~(in_stack_ffffffffffffff68);
        ClauseWatch::ClauseWatch(&local_58,in_RDI);
        Solver::addWatch(in_stack_ffffffffffffff78,LVar3,in_stack_ffffffffffffff70);
        Constraint::PropResult::PropResult(&local_2,true,false);
      }
    }
    else {
      local_28[local_2c].rep_ = local_28[2].rep_;
      local_3c = (uint32)Literal::operator~(in_stack_ffffffffffffff68);
      LVar3.rep_ = (uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      local_28[2].rep_ = local_3c;
      local_40 = (uint32)Literal::operator~(in_stack_ffffffffffffff68);
      ClauseWatch::ClauseWatch(&local_48,in_RDI);
      Solver::addWatch(in_stack_ffffffffffffff78,LVar3,in_stack_ffffffffffffff70);
      Constraint::PropResult::PropResult(&local_2,true,false);
    }
  }
  return local_2;
}

Assistant:

Constraint::PropResult ClauseHead::propagate(Solver& s, Literal p, uint32&) {
	Literal* head = head_;
	uint32 wLit   = (head[1] == ~p); // pos of false watched literal
	if (s.isTrue(head[1-wLit])) {
		return Constraint::PropResult(true, true);
	}
	else if (!s.isFalse(head[2])) {
		assert(!isSentinel(head[2]) && "Invalid ClauseHead!");
		head[wLit] = head[2];
		head[2]    = ~p;
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	else if (updateWatch(s, wLit)) {
		assert(!s.isFalse(head_[wLit]));
		s.addWatch(~head[wLit], ClauseWatch(this));
		return Constraint::PropResult(true, false);
	}
	return PropResult(s.force(head_[1^wLit], this), true);
}